

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O1

void __thiscall
TPZInterpolatedElement::RestrainSide
          (TPZInterpolatedElement *this,int side,TPZInterpolatedElement *large,int neighbourside)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  TPZConnect *pTVar13;
  TPZGeoEl *pTVar14;
  TPZFNMatrix<1000,_double> *this_00;
  long lVar15;
  int64_t myindex;
  int64_t iVar16;
  TPZDepend *pTVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t lineN;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  ulong local_35a8;
  TPZAutoPointer<TPZMatrix<double>_> local_3550;
  REAL weight;
  TPZGeoElSide largegeoside;
  TPZGeoElSide thisgeoside;
  double local_3510;
  TPZCompElSide largecompside;
  TPZManVector<double,_3> pointl;
  TPZFNMatrix<20,_double> blocknorm;
  TPZManVector<double,_3> par;
  TPZCompElSide thisside;
  TPZBlock MBlocksmall;
  TPZBlock MBlocklarge;
  TPZGeoElSide local_31a0;
  TPZFNMatrix<100,_double> phis;
  TPZFNMatrix<100,_double> phil;
  TPZStepSolver<double> MSolve;
  TPZFNMatrix<100,_double> dphil;
  TPZFNMatrix<100,_double> dphis;
  TPZTransform<double> t;
  TPZFNMatrix<1000,_double> MSL;
  
  thisside.fEl = (TPZCompEl *)this;
  thisside.fSide = side;
  TPZCompElSide::Reference(&thisgeoside,&thisside);
  largecompside.fEl = (TPZCompEl *)large;
  largecompside.fSide = neighbourside;
  TPZCompElSide::Reference(&largegeoside,&largecompside);
  if (largecompside.fEl == (TPZCompEl *)0x0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(largecompside.fEl,&TPZCompEl::typeinfo,&typeinfo,0);
  }
  if (plVar11 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - null computational element.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  else {
    iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                      (this,side);
    if (iVar5 < 0) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp"
                 ,0x35c);
    }
    lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                       (this,iVar5);
    if (*(int *)(lVar12 + 0x18) != 0) {
      if ((*(long *)(lVar12 + 0x20) != 0) &&
         (iVar5 = TPZGeoElSide::Dimension(&largegeoside), 0 < iVar5)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"RestrainSide - unnecessary call to restrainside",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp"
                   ,0x365);
      }
      uVar6 = (**(code **)(*plVar11 + 0x310))(plVar11,largecompside.fSide);
      lVar12 = (**(code **)(*plVar11 + 0xa0))(plVar11,uVar6);
      if (lVar12 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Exiting RestrainSide - Side of large element not initialized",0x3c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        lineN = 0x369;
      }
      else {
        iVar5 = TPZGeoElSide::Dimension(&largegeoside);
        iVar7 = TPZGeoElSide::Dimension(&thisgeoside);
        if (iVar7 <= iVar5) {
          iVar5 = TPZGeoElSide::Dimension(&thisgeoside);
          TPZTransform<double>::TPZTransform(&t,iVar5);
          local_31a0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
          local_31a0.fGeoEl = largegeoside.fGeoEl;
          local_31a0.fSide = largegeoside.fSide;
          TPZGeoElSide::SideTransform3(&thisgeoside,&local_31a0,&t);
          iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248
                              ))(this,side);
          if (iVar5 < 1) {
            iVar5 = 2;
          }
          else {
            iVar7 = 0;
            uVar20 = 1;
            do {
              pTVar13 = SideConnect(this,iVar7,side);
              bVar2 = (pTVar13->field_2).fCompose.fOrder;
              if (uVar20 <= bVar2) {
                uVar20 = (uint)bVar2;
              }
              iVar7 = iVar7 + 1;
            } while (iVar5 != iVar7);
            iVar5 = uVar20 * 2;
          }
          iVar7 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                              0x338))(large,neighbourside);
          lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                               0x318))(this,side);
          if ((((int)(uint)*(byte *)(lVar12 + 0x14) < iVar7) &&
              (iVar7 = TPZGeoElSide::Dimension(&thisgeoside), iVar7 != 0)) &&
             (iVar7 = TPZGeoElSide::Dimension(&largegeoside), iVar7 != 0)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp"
                       ,0x37d);
          }
          pTVar14 = TPZCompEl::Reference((TPZCompEl *)this);
          plVar11 = (long *)(**(code **)(*(long *)pTVar14 + 0x70))(pTVar14,side,iVar5);
          if (plVar11 == (long *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Exiting RestrainSide - cannot create side integration rule",0x3a);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          else {
            iVar5 = (**(code **)(*plVar11 + 0x18))(plVar11);
            iVar7 = NSideShapeF(this,side);
            iVar8 = TPZGeoElSide::Dimension(&thisgeoside);
            iVar9 = TPZGeoElSide::Dimension(&largegeoside);
            iVar10 = NSideShapeF(large,neighbourside);
            lVar12 = (long)iVar7;
            phis.super_TPZFMatrix<double>.fElem = phis.fBuf;
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
                 '\0';
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            phis.super_TPZFMatrix<double>.fSize = 100;
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar12;
            phis.super_TPZFMatrix<double>.fGiven = phis.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&phis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            phis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 phis.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            phis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            phis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            phis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            phis.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            phis.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            phis.super_TPZFMatrix<double>.fWork.fNElements = 0;
            phis.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar7 == 0) {
              phis.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (100 < iVar7) {
              phis.super_TPZFMatrix<double>.fElem = (double *)operator_new__(lVar12 * 8);
            }
            phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            dphis.super_TPZFMatrix<double>.fElem = dphis.fBuf;
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
                 = '\0';
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            dphis.super_TPZFMatrix<double>.fSize = 100;
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12
            ;
            dphis.super_TPZFMatrix<double>.fGiven = dphis.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&dphis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            dphis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 dphis.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            dphis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            dphis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            dphis.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            dphis.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            dphis.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            dphis.super_TPZFMatrix<double>.fWork.fNElements = 0;
            dphis.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar7 == 0) {
              dphis.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (0x32 < iVar7) {
              dphis.super_TPZFMatrix<double>.fElem = (double *)operator_new__(lVar12 << 4);
            }
            dphis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            lVar19 = (long)iVar10;
            phil.super_TPZFMatrix<double>.fElem = phil.fBuf;
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
                 '\0';
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            phil.super_TPZFMatrix<double>.fSize = 100;
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar19;
            phil.super_TPZFMatrix<double>.fGiven = phil.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&phil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            phil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 phil.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            phil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            phil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            phil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            phil.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            phil.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            phil.super_TPZFMatrix<double>.fWork.fNElements = 0;
            phil.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar10 == 0) {
              phil.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (100 < iVar10) {
              phil.super_TPZFMatrix<double>.fElem = (double *)operator_new__(lVar19 * 8);
            }
            phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            dphil.super_TPZFMatrix<double>.fElem = dphil.fBuf;
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
                 = '\0';
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            dphil.super_TPZFMatrix<double>.fSize = 100;
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar19
            ;
            dphil.super_TPZFMatrix<double>.fGiven = dphil.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&dphil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            dphil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 dphil.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            dphil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            dphil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            dphil.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            dphil.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            dphil.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            dphil.super_TPZFMatrix<double>.fWork.fNElements = 0;
            dphil.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar10 == 0) {
              dphil.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (0x32 < iVar10) {
              dphil.super_TPZFMatrix<double>.fElem = (double *)operator_new__(lVar19 << 4);
            }
            dphil.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix(&MSL,lVar12,lVar19,(double *)&blocknorm);
            this_00 = (TPZFNMatrix<1000,_double> *)operator_new(0x1fd8);
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix(this_00,lVar12,lVar12,(double *)&blocknorm);
            TPZManVector<double,_3>::TPZManVector(&par,(long)iVar8);
            TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar9);
            if (0 < iVar5) {
              iVar8 = 0;
              do {
                (**(code **)(*plVar11 + 0x20))(plVar11,iVar8,&par,&weight);
                (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                          (this,side,&par,&phis,&dphis);
                TPZTransform<double>::Apply
                          (&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
                (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288)
                )(large,neighbourside,&pointl,&phil,&dphil);
                if (0 < iVar7) {
                  lVar21 = 0;
                  do {
                    lVar25 = 0;
                    do {
                      if ((phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                           .fRow <= lVar21) ||
                         (phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                          fCol < 1)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if ((phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                           .fRow <= lVar25) ||
                         (phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                          fCol < 1)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (((this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= lVar21) ||
                         ((this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= lVar25)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      lVar15 = (this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * lVar25;
                      pdVar4 = (this_00->super_TPZFMatrix<double>).fElem;
                      pdVar4[lVar15 + lVar21] =
                           phis.super_TPZFMatrix<double>.fElem[lVar21] *
                           phis.super_TPZFMatrix<double>.fElem[lVar25] * weight +
                           pdVar4[lVar15 + lVar21];
                      lVar25 = lVar25 + 1;
                    } while (lVar12 != lVar25);
                    if (0 < iVar10) {
                      lVar25 = 0;
                      do {
                        if ((phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= lVar21) ||
                           (phis.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fCol < 1)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        if ((phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= lVar25) ||
                           (phil.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fCol < 1)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        if ((MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= lVar21) ||
                           (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                            .fCol <= lVar25)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        MSL.super_TPZFMatrix<double>.fElem
                        [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                         fRow * lVar25 + lVar21] =
                             phis.super_TPZFMatrix<double>.fElem[lVar21] *
                             phil.super_TPZFMatrix<double>.fElem[lVar25] * weight +
                             MSL.super_TPZFMatrix<double>.fElem
                             [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fRow * lVar25 + lVar21];
                        lVar25 = lVar25 + 1;
                      } while (lVar19 != lVar25);
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != lVar12);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 != iVar5);
            }
            local_3550.fRef = (TPZReference *)0x0;
            local_3550.fRef = (TPZReference *)operator_new(0x10);
            ((local_3550.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
            (local_3550.fRef)->fPointer = (TPZMatrix<double> *)this_00;
            LOCK();
            ((local_3550.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
            UNLOCK();
            TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3550);
            TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3550);
            TPZStepSolver<double>::SetDirect(&MSolve,ELU);
            TPZStepSolver<double>::Solve
                      (&MSolve,&MSL.super_TPZFMatrix<double>,&MSL.super_TPZFMatrix<double>,
                       (TPZFMatrix<double> *)0x0);
            iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x248))(this,side);
            iVar7 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x248))(large);
            TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,iVar5,1);
            TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,iVar7,1);
            uVar18 = (ulong)iVar5;
            if (0 < iVar5) {
              uVar22 = 0;
              do {
                uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                    0x250))(this,uVar22 & 0xffffffff,side);
                lVar12 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0xa8))(this,uVar6);
                TPZBlock::Set(&MBlocksmall,(int)uVar22,*(int *)(lVar12 + 0x18),-1);
                uVar22 = uVar22 + 1;
              } while (uVar18 != uVar22);
            }
            uVar22 = (ulong)iVar7;
            if (0 < iVar7) {
              uVar23 = 0;
              do {
                uVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                    + 0x250))(large,uVar23 & 0xffffffff,neighbourside);
                lVar12 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0xa8))(large,uVar6);
                TPZBlock::Set(&MBlocklarge,(int)uVar23,*(int *)(lVar12 + 0x18),-1);
                uVar23 = uVar23 + 1;
              } while (uVar22 != uVar23);
            }
            TPZBlock::Resequence(&MBlocksmall,0);
            TPZBlock::Resequence(&MBlocklarge,0);
            local_3510 = 0.0;
            TPZFNMatrix<20,_double>::TPZFNMatrix(&blocknorm,uVar18,uVar22,&local_3510);
            if (0 < iVar5) {
              uVar23 = 0;
              do {
                uVar20 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar23].dim;
                if ((ulong)uVar20 != 0 && 0 < iVar7) {
                  uVar26 = 0;
                  do {
                    uVar3 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar26].dim
                    ;
                    if ((ulong)uVar3 != 0) {
                      if (0 < (int)uVar20) {
                        iVar8 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar23]
                                .pos;
                        iVar9 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar26]
                                .pos;
                        local_35a8 = 0;
                        do {
                          if (0 < (int)uVar3) {
                            lVar12 = local_35a8 + (long)iVar8;
                            uVar24 = (ulong)uVar3;
                            lVar19 = (long)iVar9;
                            do {
                              if ((((lVar12 < 0) ||
                                   (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow <= lVar12)) || (lVar19 < 0)) ||
                                 (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= lVar19)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              if (((MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow <= lVar12 || lVar12 < 0) ||
                                  (lVar19 < 0)) ||
                                 (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= lVar19)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                   super_TPZBaseMatrix.fRow <= (long)uVar23) ||
                                 (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= (long)uVar26)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              blocknorm.super_TPZFMatrix<double>.fElem
                              [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * uVar26 + uVar23] =
                                   ABS(MSL.super_TPZFMatrix<double>.fElem
                                       [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar19 + lVar12]) *
                                   ABS(MSL.super_TPZFMatrix<double>.fElem
                                       [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar19 + lVar12]) +
                                   blocknorm.super_TPZFMatrix<double>.fElem
                                   [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow * uVar26 + uVar23];
                              lVar19 = lVar19 + 1;
                              uVar24 = uVar24 - 1;
                            } while (uVar24 != 0);
                          }
                          local_35a8 = local_35a8 + 1;
                        } while (local_35a8 != uVar20);
                      }
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar23) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar26)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar26 + uVar23] =
                           blocknorm.super_TPZFMatrix<double>.fElem
                           [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fRow * uVar26 + uVar23] /
                           (double)(int)(uVar20 * uVar3);
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar23) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar26)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      dVar1 = blocknorm.super_TPZFMatrix<double>.fElem
                              [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * uVar26 + uVar23];
                      if (dVar1 < 0.0) {
                        dVar1 = sqrt(dVar1);
                      }
                      else {
                        dVar1 = SQRT(dVar1);
                      }
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar23) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar26)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar26 + uVar23] = dVar1;
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar22);
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar18);
            }
            uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x310))(this,side);
            pTVar13 = (TPZConnect *)
                      (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                  0xa8))(this,uVar6);
            uVar6 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x310))(this,side);
            myindex = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                  0xa0))(this,uVar6);
            lVar12 = (long)(iVar5 + -1);
            if (iVar7 < 1) {
              bVar27 = true;
            }
            else {
              lVar19 = 0xc;
              lVar21 = 0;
              uVar18 = 0;
              do {
                if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].dim != 0) &&
                   (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                    super_TPZSavable)._vptr_TPZSavable + lVar19) != 0)) {
                  uVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).
                                                 super_TPZCompEl + 0x250))
                                    (large,uVar18 & 0xffffffff,neighbourside);
                  iVar16 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).
                                                  super_TPZCompEl + 0xa0))(large,uVar6);
                  pTVar17 = TPZConnect::AddDependency
                                      (pTVar13,myindex,iVar16,&MSL.super_TPZFMatrix<double>,
                                       (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                             [lVar12].pos,
                                       (long)*(int *)((long)MBlocklarge.fBlock.
                                                            super_TPZVec<TPZBlock::TNode>.fStore +
                                                     lVar19 + -4),
                                       MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                       [lVar12].dim,
                                       *(int *)((long)&((MBlocklarge.fBlock.
                                                         super_TPZVec<TPZBlock::TNode>.fStore)->
                                                       super_TPZSavable)._vptr_TPZSavable + lVar19))
                  ;
                  if ((iVar5 < 1) ||
                     ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow <= lVar12 ||
                      (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fCol <= (long)uVar18)))) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if (blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar18 + lVar12] <= 1e-08 &&
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar18 + lVar12] != 1e-08) {
                    memset((pTVar17->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                           (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow *
                           (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fCol * 8);
                    (pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fDecomposed = '\0';
                  }
                  lVar21 = lVar21 + 1;
                }
                uVar18 = uVar18 + 1;
                lVar19 = lVar19 + 0x10;
              } while (uVar22 != uVar18);
              bVar27 = lVar21 == 0;
            }
            if (!(bool)(bVar27 ^ 1U | iVar7 < 1)) {
              lVar19 = 0xc;
              uVar18 = 0;
              do {
                uVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                    + 0x250))(large,uVar18 & 0xffffffff,neighbourside);
                iVar16 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0xa0))(large,uVar6);
                iVar5 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                        super_TPZSavable)._vptr_TPZSavable + lVar19);
                if (iVar5 != 0) {
                  TPZConnect::AddDependency
                            (pTVar13,myindex,iVar16,&MSL.super_TPZFMatrix<double>,
                             (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].
                                   pos,
                             (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                                  fStore + lVar19 + -4),
                             MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].dim,
                             iVar5);
                }
                uVar18 = uVar18 + 1;
                lVar19 = lVar19 + 0x10;
              } while (uVar22 != uVar18);
            }
            (**(code **)(*plVar11 + 8))();
            TPZFMatrix<double>::~TPZFMatrix(&blocknorm.super_TPZFMatrix<double>,&PTR_PTR_0183e568);
            TPZBlock::~TPZBlock(&MBlocklarge);
            TPZBlock::~TPZBlock(&MBlocksmall);
            TPZStepSolver<double>::~TPZStepSolver(&MSolve);
            TPZManVector<double,_3>::~TPZManVector(&pointl);
            TPZManVector<double,_3>::~TPZManVector(&par);
            TPZFMatrix<double>::~TPZFMatrix(&MSL.super_TPZFMatrix<double>,&PTR_PTR_01884558);
            TPZFMatrix<double>::~TPZFMatrix(&dphil.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&phil.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&dphis.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&phis.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
          }
          TPZTransform<double>::~TPZTransform(&t);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Exiting RestrainSide - Trying to restrict to a side of smaller dimension",0x48);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        lineN = 0x36e;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp"
                 ,lineN);
    }
  }
  return;
}

Assistant:

void TPZInterpolatedElement::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    TPZCompElSide thisside(this, side);
    TPZGeoElSide thisgeoside = thisside.Reference();
    TPZCompElSide largecompside(large, neighbourside);
    TPZGeoElSide largegeoside = largecompside.Reference();
    TPZInterpolatedElement *cel = nullptr;
    if (largecompside.Exists()) cel = dynamic_cast<TPZInterpolatedElement *> (largecompside.Element());
    if (!cel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    int locind = MidSideConnectLocId(side);
    if (locind < 0) {
        DebugStop();
    }
    TPZConnect &myconnect = Connect(locind);
    if (myconnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myconnect.HasDependency() && largegeoside.Dimension() > 0) {
        LOGPZ_WARN(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (cel->ConnectIndex(cel->MidSideConnectLocId(largecompside.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largegeoside.Dimension() < thisgeoside.Dimension()) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Trying to restrict to a side of smaller dimension");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisgeoside.Dimension());
    thisgeoside.SideTransform3(largegeoside, t);
    int nsideconnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nsideconnects; sidecon++) {
        TPZConnect &c = SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    int largeorder = large->EffectiveSideOrder(neighbourside);
    int sideorder = MidSideConnect(side).Order();
    if (sideorder < largeorder && thisgeoside.Dimension() && largegeoside.Dimension()) {
        DebugStop();
    }
    TPZIntPoints *intrule = Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    int numint = intrule->NPoints();
    int numshape = NSideShapeF(side);
    int sidedimension = thisgeoside.Dimension();
    int largesidedimension = largegeoside.Dimension();
    int numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<100, REAL> phis(numshape, 1), dphis(2, numshape), phil(numshapel, 1), dphil(2, numshapel);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(sidedimension), pointl(largesidedimension); //,point(3);
    int64_t in, jn;
    REAL weight;
    for (int it = 0; it < numint; it++) {
        intrule->Point(it, par, weight);
        SideShapeFunction(side, par, phis, dphis);
        t.Apply(par, pointl);
        large->SideShapeFunction(neighbourside, pointl, phil, dphil);
        for (in = 0; in < numshape; in++) {
            for (jn = 0; jn < numshape; jn++) {
                (*M)(in, jn) += phis(in, 0) * phis(jn, 0) * weight;
            }
            for (jn = 0; jn < numshapel; jn++) {
                MSL(in, jn) += phis(in, 0) * phil(jn, 0) * weight;
            }
        }
    }
#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    //MSolve.ResetMatrix();
    int numsidenodes_small = NSideConnects(side);
    // Philippe 12/3/99
    //  int numsidenodes_large = NSideConnects(neighbourside);
    int numsidenodes_large = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, numsidenodes_small), MBlocklarge(0, numsidenodes_large);
    for (in = 0; in < numsidenodes_small; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (in = 0; in < numsidenodes_large; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(numsidenodes_small, numsidenodes_large, 0.);
    for (in = 0; in < numsidenodes_small; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = Connect(MidSideConnectLocId(side));
    int64_t inodindex = ConnectIndex(MidSideConnectLocId(side));
    int64_t ndepend = 0;
    in = numsidenodes_small - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (jn = 0; jn < numsidenodes_large; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        //cout << "Caso esquisito!!! Chame o Boss que vc receberem premio\n";
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                        MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // a matriz frestraint deveria ser igual a MSL
    TPZCheckRestraint test(thisside, largecompside);
    //test.Print(cout);
    int64_t imsl, jmsl;
    int64_t rmsl = MSL.Rows();
    int64_t cmsl = MSL.Cols();
    int64_t rtest = test.RestraintMatrix().Rows();
    int64_t ctest = test.RestraintMatrix().Cols();

    if (rtest != rmsl || ctest != cmsl) {
        stringstream sout;
        sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n"
                << "press any key to continue";
        LOGPZ_ERROR(logger, sout.str());
        int a;
        cin >> a;
        return;
    }

    TPZFMatrix<REAL> mslc(MSL);
    mslc -= test.RestraintMatrix();

    REAL normmsl = 0.;
    for (imsl = 0; imsl < rmsl; imsl++) {
        for (jmsl = 0; jmsl < cmsl; jmsl++) {
            normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
        }
    }
    if (normmsl > 1.E-6) {
        stringstream sout;
        sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
        mslc.Print("Difference Matrix ", sout);
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                    sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                            << test.RestraintMatrix()(imsl, jmsl) << endl;
                }
            }
        }
        LOGPZ_ERROR(logger, sout.str());
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
    }

    // verificar a norma de MSL
    if (test.CheckRestraint()) {
        stringstream sout
        sout << "TPZInterpolatedElement::Error::Bad restraints detected\n"; // recado de erro.
        test.Print(sout);
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
        test.Diagnose();
        LOGPZ_ERROR(logger, sout.str());
        TPZCheckRestraint test2(thisside, largecompside);
    }
#endif
}